

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshAddComponent(FmsMesh mesh,char *comp_name,FmsComponent *comp)

{
  char *pcVar1;
  int iVar2;
  char *str;
  char **str_copy_p;
  undefined8 *in_RDX;
  long in_RDI;
  FmsComponent component;
  FmsInt nc;
  FmsComponent *comps;
  FmsInt num_comps;
  void *local_30;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RDX == (undefined8 *)0x0) {
    local_4 = 2;
  }
  else {
    pcVar1 = *(char **)(in_RDI + 8);
    local_30 = *(void **)(in_RDI + 0x30);
    str = (char *)NextPow2((FmsInt)(pcVar1 + 1));
    if (pcVar1 <= (char *)((ulong)str >> 1)) {
      local_30 = realloc(local_30,(long)str << 3);
      if (local_30 == (void *)0x0) {
        return 3;
      }
      *(void **)(in_RDI + 0x30) = local_30;
    }
    str_copy_p = (char **)calloc(1,0x48);
    if (str_copy_p == (char **)0x0) {
      local_4 = 3;
    }
    else {
      iVar2 = FmsCopyString(str,str_copy_p);
      if (iVar2 == 0) {
        str_copy_p[1] = pcVar1;
        str_copy_p[2] = (char *)0x7f;
        *(char ***)((long)local_30 + (long)pcVar1 * 8) = str_copy_p;
        *(char **)(in_RDI + 8) = pcVar1 + 1;
        *in_RDX = str_copy_p;
        local_4 = 0;
      }
      else {
        free(str_copy_p);
        local_4 = 3;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsMeshAddComponent(FmsMesh mesh, const char *comp_name,
                        FmsComponent *comp) {
  if (!mesh) { E_RETURN(1); }
  if (!comp) { E_RETURN(2); }
  FmsInt num_comps = mesh->num_comps;
  FmsComponent *comps = mesh->comps;
  // Reallocate mesh->comps, if necessary
  FmsInt nc = NextPow2(num_comps+1);
  if (num_comps <= nc/2) {
    comps = realloc(comps, nc*sizeof(*comps));
    if (comps == NULL) { E_RETURN(3); }
    mesh->comps = comps;
  }
  FmsComponent component;
  component = calloc(1, sizeof(*component));
  if (component == NULL) { E_RETURN(3); }
  // On error, call free(component)
  if (FmsCopyString(comp_name, &component->name)) {
    free(component); E_RETURN(3);
  }
  component->id = num_comps;
  component->dim = FMS_INVALID_DIM;
  comps[num_comps] = component;
  mesh->num_comps = num_comps+1;
  *comp = component;
  return 0;
}